

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxDumper.h
# Opt level: O2

Action __thiscall
psy::C::SyntaxDumper::visitParameterDeclaration(SyntaxDumper *this,ParameterDeclarationSyntax *node)

{
  long lVar1;
  ParameterDeclarationSyntax *pPVar2;
  
  pPVar2 = node + 0x28;
  while( true ) {
    lVar1 = *(long *)pPVar2;
    if (lVar1 == 0) break;
    (**(code **)(*(long *)this + 0x2f0))(this,*(undefined8 *)(lVar1 + 8));
    pPVar2 = (ParameterDeclarationSyntax *)(lVar1 + 0x10);
  }
  (**(code **)(*(long *)this + 0x2f0))(this,*(undefined8 *)(node + 0x30));
  return Skip;
}

Assistant:

virtual Action visitParameterDeclaration(const ParameterDeclarationSyntax* node) override
    {
        for (auto iter = node->specifiers(); iter; iter = iter->next)
            nonterminal(iter->value);
        nonterminal(node->declarator());
        return Action::Skip;
    }